

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O1

void __thiscall undo::UndoHistory::moveTo(UndoHistory *this,UndoState *new_state)

{
  UndoState *pUVar1;
  UndoState *pUVar2;
  UndoState *pUVar3;
  UndoState *pUVar4;
  stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
  redo_parents;
  UndoState *local_80;
  _Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_> local_78;
  
  pUVar1 = this->m_cur;
  if (new_state == (UndoState *)0x0 || pUVar1 == (UndoState *)0x0) {
LAB_0010183b:
    pUVar4 = (UndoState *)0x0;
  }
  else {
    pUVar2 = new_state;
    pUVar4 = pUVar1;
    pUVar3 = pUVar1;
    if (pUVar1 != new_state) {
      do {
        pUVar4 = pUVar3->m_parent;
        if ((pUVar3->m_parent == (UndoState *)0x0) &&
           (pUVar2 = pUVar2->m_parent, pUVar4 = pUVar1, pUVar2 == (UndoState *)0x0))
        goto LAB_0010183b;
        pUVar3 = pUVar4;
      } while (pUVar4 != pUVar2);
    }
  }
  if (pUVar1 != (UndoState *)0x0) {
    pUVar1 = this->m_cur;
    while (pUVar1 != pUVar4) {
      (*pUVar1->m_cmd->_vptr_UndoCommand[2])();
      pUVar1 = this->m_cur->m_parent;
      this->m_cur = pUVar1;
    }
  }
  if (new_state != (UndoState *)0x0) {
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>::
    _M_initialize_map(&local_78,0);
    local_80 = new_state;
    if (pUVar4 != new_state) {
      do {
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>::
          _M_push_back_aux<undo::UndoState_const*const&>
                    ((deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>> *)
                     &local_78,&local_80);
        }
        else {
          *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_80;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        local_80 = local_80->m_parent;
      } while (local_80 != pUVar4);
    }
    while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_80 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_78._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_78._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_80 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      (*local_80->m_cmd->_vptr_UndoCommand[3])();
    }
    std::_Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>::
    ~_Deque_base(&local_78);
  }
  this->m_cur = new_state;
  return;
}

Assistant:

void UndoHistory::moveTo(const UndoState* new_state)
{
  const UndoState* common = findCommonParent(m_cur, new_state);

  if (m_cur) {
    while (m_cur != common) {
      m_cur->m_cmd->undo();
      m_cur = m_cur->m_parent;
    }
  }

  if (new_state) {
    std::stack<const UndoState*> redo_parents;
    const UndoState* p = new_state;
    while (p != common) {
      redo_parents.push(p);
      p = p->m_parent;
    }

    while (!redo_parents.empty()) {
      p = redo_parents.top();
      redo_parents.pop();

      p->m_cmd->redo();
    }
  }

  m_cur = const_cast<UndoState*>(new_state);
}